

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O2

void Txs3_ManStop(Txs3_Man_t *p)

{
  Gia_ManStop(p->pGia);
  Vec_IntFree(p->vCiObjs);
  Vec_IntFree(p->vFosPre);
  Vec_IntFree(p->vFosAbs);
  Vec_IntFree(p->vCoObjs);
  Vec_IntFree(p->vCiVals);
  Vec_IntFree(p->vCoVals);
  Vec_IntFree(p->vNodes);
  Vec_IntFree(p->vTemp);
  Vec_IntFree(p->vPiLits);
  Vec_IntFree(p->vFfLits);
  free(p);
  return;
}

Assistant:

void Txs3_ManStop( Txs3_Man_t * p )
{
    Gia_ManStop( p->pGia );
    Vec_IntFree( p->vCiObjs );
    Vec_IntFree( p->vFosPre );
    Vec_IntFree( p->vFosAbs );
    Vec_IntFree( p->vCoObjs );
    Vec_IntFree( p->vCiVals );
    Vec_IntFree( p->vCoVals );
    Vec_IntFree( p->vNodes );
    Vec_IntFree( p->vTemp );
    Vec_IntFree( p->vPiLits );
    Vec_IntFree( p->vFfLits );
    ABC_FREE( p );
}